

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_alphamapblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  int iVar1;
  long lVar2;
  DestFetchProc64 p_Var3;
  QRgba64 srcColor_00;
  bool bVar4;
  int iVar5;
  int *piVar6;
  QRgba64 *pQVar7;
  QRgba64 QVar8;
  int *piVar9;
  QColorTrcLut *colorProfile_00;
  QRgba64 *in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  QRgba64 *dest_1;
  int end;
  int start;
  QT_FT_Span *clip_1;
  byte in_stack_00000020;
  int i_1;
  ClipLine *line;
  int yp;
  int top;
  int bottom;
  QRgba64 *dest;
  int l;
  int i;
  int ly;
  DestStoreProc64 destStore64;
  DestFetchProc64 destFetch64;
  QColorTrcLut *colorProfile;
  int length;
  QRgba64 srcColor;
  QRgba64 buffer [2048];
  QColorTrcLut *in_stack_ffffffffffffbf10;
  undefined4 in_stack_ffffffffffffbf18;
  int iVar10;
  undefined4 in_stack_ffffffffffffbf1c;
  int iVar11;
  undefined8 in_stack_ffffffffffffbf20;
  undefined4 in_stack_ffffffffffffbf28;
  undefined4 in_stack_ffffffffffffbf2c;
  int iVar12;
  QRgba64 in_stack_ffffffffffffbf30;
  undefined4 in_stack_ffffffffffffbf38;
  undefined4 in_stack_ffffffffffffbf3c;
  int local_40a8;
  int local_40a4;
  QClipData *this;
  QColorTrcLut *local_4090;
  int local_4054;
  int local_4050 [3];
  int local_4044;
  quint64 local_4040;
  quint64 local_4038;
  int local_402c;
  quint64 local_4028;
  quint64 local_4020;
  quint64 local_4018;
  int local_4010;
  int local_400c;
  QRgba64 local_4008 [8];
  QRgba64 in_stack_ffffffffffffc038;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_4010 = in_EDX;
  local_400c = in_ESI;
  bVar4 = QRgba64::isTransparent(in_RCX);
  if (!bVar4) {
    local_4090 = (QColorTrcLut *)0x0;
    if ((in_stack_00000020 & 1) != 0) {
      QGuiApplicationPrivate::instance();
      local_4090 = QGuiApplicationPrivate::colorProfileForA8Text((QGuiApplicationPrivate *)0xb4487e)
      ;
    }
    local_4018 = in_RCX->rgba;
    if ((local_4090 != (QColorTrcLut *)0x0) && (bVar4 = QRgba64::isOpaque(in_RCX), bVar4)) {
      local_4028 = local_4018;
      local_4020 = (quint64)QColorTrcLut::toLinear
                                      (in_stack_ffffffffffffbf10,in_stack_ffffffffffffc038);
      local_4018 = local_4020;
    }
    p_Var3 = destFetchProc64[in_RDI->format];
    this = (QClipData *)destStoreProc64[in_RDI->format];
    if (clip_1 == (QT_FT_Span *)0x0) {
      for (local_40a4 = 0; local_40a4 < (int)dest_1; local_40a4 = local_40a4 + 1) {
        local_40a8 = local_400c;
        for (local_402c = in_R9D; 0 < local_402c; local_402c = local_402c - iVar1) {
          piVar6 = qMin<int>(&BufferSize,&local_402c);
          iVar1 = *piVar6;
          pQVar7 = (*p_Var3)(local_4008,in_RDI,local_40a8,local_4010 + local_40a4,iVar1);
          local_4038 = local_4018;
          local_4040 = in_RCX->rgba;
          QVar8.rgba._4_4_ = in_stack_ffffffffffffbf3c;
          QVar8.rgba._0_4_ = in_stack_ffffffffffffbf38;
          qt_alphamapblit_generic_oneline
                    ((uchar *)CONCAT44(in_stack_ffffffffffffbf2c,in_stack_ffffffffffffbf28),
                     (int)((ulong)in_stack_ffffffffffffbf20 >> 0x20),QVar8,
                     (QRgba64 *)CONCAT44(in_stack_ffffffffffffbf1c,in_stack_ffffffffffffbf18),
                     in_stack_ffffffffffffbf30,in_stack_ffffffffffffbf10);
          if (this != (QClipData *)0x0) {
            (*(code *)this)(in_RDI,local_40a8,local_4010 + local_40a4,pQVar7,iVar1);
          }
          local_40a8 = iVar1 + local_40a8;
        }
      }
    }
    else {
      local_4044 = local_4010 + (int)dest_1;
      local_4050[2] = QRasterBuffer::height(in_RDI);
      piVar6 = qMin<int>(&local_4044,local_4050 + 2);
      iVar1 = *piVar6;
      local_4050[1] = 0;
      piVar6 = qMax<int>(&local_4010,local_4050 + 1);
      iVar5 = *piVar6;
      QClipData::initialize(this);
      for (; iVar5 < iVar1; iVar5 = iVar5 + 1) {
        QVar8.rgba = *(long *)&clip_1->y + (long)iVar5 * 0x10;
        for (iVar12 = 0; iVar12 < *(int *)QVar8.rgba; iVar12 = iVar12 + 1) {
          piVar6 = (int *)(*(long *)(QVar8.rgba + 8) + (long)iVar12 * 0x10);
          piVar9 = qMax<int>(&local_400c,piVar6);
          iVar11 = *piVar9;
          local_4050[0] = local_400c + in_R9D;
          local_4054 = *piVar6 + piVar6[1];
          piVar9 = qMin<int>(local_4050,&local_4054);
          iVar10 = *piVar9;
          if (iVar11 < iVar10) {
            colorProfile_00 =
                 (QColorTrcLut *)(*p_Var3)(local_4008,in_RDI,iVar11,piVar6[2],iVar10 - iVar11);
            srcColor_00.rgba._4_4_ = iVar5;
            srcColor_00.rgba._0_4_ = in_stack_ffffffffffffbf38;
            qt_alphamapblit_generic_oneline
                      ((uchar *)CONCAT44(iVar12,in_stack_ffffffffffffbf28),
                       (int)((ulong)piVar6 >> 0x20),srcColor_00,(QRgba64 *)CONCAT44(iVar11,iVar10),
                       QVar8,colorProfile_00);
            if (this != (QClipData *)0x0) {
              (*(code *)this)(in_RDI,iVar11,piVar6[2],colorProfile_00,iVar10 - iVar11);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uchar *map,
                                    int mapWidth, int mapHeight, int mapStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);

                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);
                qt_alphamapblit_generic_oneline(map + start - x, end - start,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}